

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O1

Var create_type_object(Context *ctx,Type type)

{
  Var obj;
  char *src;
  
  obj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
  if (type < Anyfunc) {
    if (type == Void) {
      src = "void";
      goto LAB_00f3b607;
    }
    if (type == Func) {
      src = "func";
      goto LAB_00f3b607;
    }
    if (type == ExceptRef) {
      src = "except_ref";
      goto LAB_00f3b607;
    }
switchD_00f3b592_caseD_fffffff1:
    src = "<type index>";
  }
  else {
    switch(type) {
    case Any:
      src = "any";
      break;
    case Anyfunc:
      src = "anyfunc";
      break;
    default:
      goto switchD_00f3b592_caseD_fffffff1;
    case V128:
      src = "v128";
      break;
    case F64:
      src = "f64";
      break;
    case F32:
      src = "f32";
      break;
    case I64:
      src = "i64";
      break;
    case I32:
      src = "i32";
    }
  }
LAB_00f3b607:
  write_string(ctx,obj,0xb,src,0xffffffff);
  return obj;
}

Assistant:

Js::Var create_type_object(Context* ctx, Type type)
{
    Js::Var typeObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
    write_string(ctx, typeObj, PropertyIds::type, GetTypeName(type));
    return typeObj;
}